

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV1MaterialListBlock(Parser *this)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  uint iMaterialCount;
  uint iIndex;
  uint local_344;
  int local_340;
  int local_33c;
  string local_338;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_318;
  value_type local_310;
  
  local_344 = 0;
  local_318 = &this->m_vMaterials;
  local_33c = (int)((ulong)((long)(this->m_vMaterials).
                                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_vMaterials).
                                 super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x1642c859;
  local_340 = 0;
LAB_003a161e:
  pcVar3 = this->filePtr;
  cVar1 = *pcVar3;
  if (cVar1 == '*') {
    this->filePtr = pcVar3 + 1;
    iVar4 = strncmp("MATERIAL_COUNT",pcVar3 + 1,0xe);
    if (iVar4 == 0) {
      bVar2 = pcVar3[0xf];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_003a164e;
      pcVar6 = pcVar3 + 0x10;
      if (bVar2 == 0) {
        pcVar6 = pcVar3 + 0xf;
      }
      this->filePtr = pcVar6;
      ParseLV4MeshLong(this,&local_344);
      uVar5 = local_344;
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"INVALID","");
      D3DS::Material::Material(&local_310.super_Material,&local_338);
      local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_007fea08;
      local_310.avSubMaterials.
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_310.pcInstance = (aiMaterial *)0x0;
      local_310.avSubMaterials.
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_310.avSubMaterials.
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_310.bNeed = false;
      std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::resize
                (local_318,(ulong)(uVar5 + local_33c),&local_310);
      local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_007fea08;
      std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector
                (&local_310.avSubMaterials);
      D3DS::Material::~Material(&local_310.super_Material);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003a161e;
    }
LAB_003a164e:
    pcVar3 = this->filePtr;
    iVar4 = strncmp("MATERIAL",pcVar3,8);
    if (iVar4 == 0) {
      bVar2 = pcVar3[8];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_003a171e;
      pcVar6 = pcVar3 + 9;
      if (bVar2 == 0) {
        pcVar6 = pcVar3 + 8;
      }
      this->filePtr = pcVar6;
      local_310.super_Material._vptr_Material =
           (_func_int **)((ulong)local_310.super_Material._vptr_Material & 0xffffffff00000000);
      ParseLV4MeshLong(this,(uint *)&local_310);
      uVar5 = local_344;
      if (local_344 <= (uint)local_310.super_Material._vptr_Material) {
        LogWarning(this,"Out of range: material index is too large");
        local_310.super_Material._vptr_Material =
             (_func_int **)CONCAT44(local_310.super_Material._vptr_Material._4_4_,uVar5 - 1);
      }
      ParseLV2MaterialBlock
                (this,(this->m_vMaterials).
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      ((uint)local_310.super_Material._vptr_Material + local_33c));
      goto LAB_003a161e;
    }
  }
  else {
    if (cVar1 == '\0') {
      return;
    }
    if (cVar1 == '{') {
      local_340 = local_340 + 1;
    }
    else if ((cVar1 == '}') && (local_340 = local_340 + -1, local_340 == 0)) {
      this->filePtr = pcVar3 + 1;
      SkipToNextToken(this);
      return;
    }
  }
LAB_003a171e:
  uVar5 = (uint)(byte)*this->filePtr;
  if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) && (this->bLastWasEndLine == false))
  {
    this->iLineNumber = this->iLineNumber + 1;
    this->bLastWasEndLine = true;
  }
  else {
    this->bLastWasEndLine = false;
  }
  this->filePtr = this->filePtr + 1;
  goto LAB_003a161e;
}

Assistant:

void Parser::ParseLV1MaterialListBlock()
{
    AI_ASE_PARSER_INIT();

    unsigned int iMaterialCount = 0;
    unsigned int iOldMaterialCount = (unsigned int)m_vMaterials.size();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_COUNT",14))
            {
                ParseLV4MeshLong(iMaterialCount);

                // now allocate enough storage to hold all materials
                m_vMaterials.resize(iOldMaterialCount+iMaterialCount, Material("INVALID"));
                continue;
            }
            if (TokenMatch(filePtr,"MATERIAL",8))
            {
                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iMaterialCount)
                {
                    LogWarning("Out of range: material index is too large");
                    iIndex = iMaterialCount-1;
                }

                // get a reference to the material
                Material& sMat = m_vMaterials[iIndex+iOldMaterialCount];
                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}